

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::to_combined_image_sampler_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,VariableID image_id,VariableID samp_id)

{
  Parameter *pPVar1;
  CombinedImageSampler *pCVar2;
  CombinedImageSamplerParameter *pCVar3;
  SPIRFunction *pSVar4;
  Parameter *pPVar5;
  size_t sVar6;
  long lVar7;
  SPIRVariable *pSVar8;
  SPIRVariable *pSVar9;
  long *plVar10;
  runtime_error *prVar11;
  CombinedImageSampler *pCVar12;
  size_type *psVar13;
  Parameter *pPVar14;
  CombinedImageSampler *pCVar15;
  CombinedImageSamplerParameter *pCVar16;
  Parameter *pPVar17;
  CombinedImageSamplerParameter *pCVar18;
  Parameter *pPVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  string array_expr;
  string image_expr;
  string local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  string local_50;
  
  to_non_uniform_aware_expression_abi_cxx11_(&local_50,this,image_id.id);
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  lVar7 = ::std::__cxx11::string::find((char)&local_50,0x5b);
  if (lVar7 != -1) {
    ::std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_50);
    ::std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  pSVar4 = (this->super_Compiler).current_function;
  pSVar8 = Compiler::maybe_get_backing_variable(&this->super_Compiler,image_id.id);
  pSVar9 = Compiler::maybe_get_backing_variable(&this->super_Compiler,samp_id.id);
  if (pSVar8 != (SPIRVariable *)0x0) {
    image_id.id = (pSVar8->super_IVariant).self.id;
  }
  if (pSVar9 != (SPIRVariable *)0x0) {
    samp_id.id = (pSVar9->super_IVariant).self.id;
  }
  pPVar5 = (pSVar4->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
  sVar6 = (pSVar4->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
  pPVar1 = pPVar5 + sVar6;
  lVar7 = (long)sVar6 >> 2;
  pPVar19 = pPVar5;
  if (0 < lVar7) {
    pPVar19 = pPVar5 + lVar7 * 4;
    lVar20 = lVar7 + 1;
    pPVar14 = pPVar5 + 2;
    do {
      if (pPVar14[-2].id.id == image_id.id) {
        pPVar14 = pPVar14 + -2;
        goto LAB_001f2f6f;
      }
      if (pPVar14[-1].id.id == image_id.id) {
        pPVar14 = pPVar14 + -1;
        goto LAB_001f2f6f;
      }
      if ((pPVar14->id).id == image_id.id) goto LAB_001f2f6f;
      if (pPVar14[1].id.id == image_id.id) {
        pPVar14 = pPVar14 + 1;
        goto LAB_001f2f6f;
      }
      lVar20 = lVar20 + -1;
      pPVar14 = pPVar14 + 4;
    } while (1 < lVar20);
  }
  lVar20 = ((long)pPVar1 - (long)pPVar19 >> 2) * -0x3333333333333333;
  if (lVar20 == 1) {
LAB_001f2f63:
    pPVar14 = pPVar19;
    if ((pPVar19->id).id != image_id.id) {
      pPVar14 = pPVar1;
    }
  }
  else {
    pPVar14 = pPVar19;
    if (lVar20 == 2) {
LAB_001f2f42:
      if ((pPVar14->id).id != image_id.id) {
        pPVar19 = pPVar14 + 1;
        goto LAB_001f2f63;
      }
    }
    else {
      pPVar14 = pPVar1;
      if ((lVar20 == 3) && (pPVar14 = pPVar19, (pPVar19->id).id != image_id.id)) {
        pPVar14 = pPVar19 + 1;
        goto LAB_001f2f42;
      }
    }
  }
LAB_001f2f6f:
  pPVar19 = pPVar5;
  if (0 < lVar7) {
    pPVar19 = pPVar5 + lVar7 * 4;
    lVar7 = lVar7 + 1;
    pPVar17 = pPVar5 + 2;
    do {
      if (pPVar17[-2].id.id == samp_id.id) {
        pPVar17 = pPVar17 + -2;
        goto LAB_001f300d;
      }
      if (pPVar17[-1].id.id == samp_id.id) {
        pPVar17 = pPVar17 + -1;
        goto LAB_001f300d;
      }
      if ((pPVar17->id).id == samp_id.id) goto LAB_001f300d;
      if (pPVar17[1].id.id == samp_id.id) {
        pPVar17 = pPVar17 + 1;
        goto LAB_001f300d;
      }
      lVar7 = lVar7 + -1;
      pPVar17 = pPVar17 + 4;
    } while (1 < lVar7);
  }
  lVar7 = ((long)pPVar1 - (long)pPVar19 >> 2) * -0x3333333333333333;
  if (lVar7 == 1) {
LAB_001f3001:
    pPVar17 = pPVar19;
    if ((pPVar19->id).id != samp_id.id) {
      pPVar17 = pPVar1;
    }
  }
  else {
    pPVar17 = pPVar19;
    if (lVar7 == 2) {
LAB_001f2fe0:
      if ((pPVar17->id).id != samp_id.id) {
        pPVar19 = pPVar17 + 1;
        goto LAB_001f3001;
      }
    }
    else {
      pPVar17 = pPVar1;
      if ((lVar7 == 3) && (pPVar17 = pPVar19, (pPVar19->id).id != samp_id.id)) {
        pPVar17 = pPVar19 + 1;
        goto LAB_001f2fe0;
      }
    }
  }
LAB_001f300d:
  if ((pPVar14 != pPVar1) || (pPVar17 != pPVar1)) {
    if (pPVar14 != pPVar1) {
      image_id.id = (int)((ulong)((long)pPVar14 - (long)pPVar5) >> 2) * -0x33333333;
    }
    bVar21 = pPVar17 == pPVar1;
    if (!bVar21) {
      samp_id.id = (int)((ulong)((long)pPVar17 - (long)pPVar5) >> 2) * -0x33333333;
    }
    bVar22 = pPVar14 == pPVar1;
    pSVar4 = (this->super_Compiler).current_function;
    pCVar16 = (pSVar4->combined_parameters).
              super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.ptr;
    sVar6 = (pSVar4->combined_parameters).
            super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.buffer_size;
    pCVar3 = pCVar16 + sVar6;
    pCVar18 = pCVar16;
    if (0 < (long)sVar6 >> 2) {
      pCVar18 = (CombinedImageSamplerParameter *)
                ((long)&(pCVar16->id).id + (sVar6 * 0x10 & 0xffffffffffffffc0));
      lVar7 = ((long)sVar6 >> 2) + 1;
      pCVar16 = pCVar16 + 2;
      do {
        if ((((pCVar16[-2].global_image == bVar22) && (pCVar16[-2].global_sampler == bVar21)) &&
            (pCVar16[-2].image_id.id == image_id.id)) && (pCVar16[-2].sampler_id.id == samp_id.id))
        {
          pCVar16 = pCVar16 + -2;
          goto LAB_001f32dc;
        }
        if (((pCVar16[-1].global_image == bVar22) && (pCVar16[-1].global_sampler == bVar21)) &&
           ((pCVar16[-1].image_id.id == image_id.id && (pCVar16[-1].sampler_id.id == samp_id.id))))
        {
          pCVar16 = pCVar16 + -1;
          goto LAB_001f32dc;
        }
        if (((pCVar16->global_image == bVar22) && (pCVar16->global_sampler == bVar21)) &&
           (((pCVar16->image_id).id == image_id.id && ((pCVar16->sampler_id).id == samp_id.id))))
        goto LAB_001f32dc;
        if ((((pCVar16[1].global_image == bVar22) && (pCVar16[1].global_sampler == bVar21)) &&
            (pCVar16[1].image_id.id == image_id.id)) && (pCVar16[1].sampler_id.id == samp_id.id)) {
          pCVar16 = pCVar16 + 1;
          goto LAB_001f32dc;
        }
        lVar7 = lVar7 + -1;
        pCVar16 = pCVar16 + 4;
      } while (1 < lVar7);
    }
    lVar7 = (long)pCVar3 - (long)pCVar18 >> 4;
    if (lVar7 == 1) {
LAB_001f3241:
      pCVar16 = pCVar3;
      if ((((pCVar18->global_image == bVar22) && (pCVar18->global_sampler == bVar21)) &&
          ((pCVar18->image_id).id == image_id.id)) &&
         (pCVar16 = pCVar18, (pCVar18->sampler_id).id != samp_id.id)) {
        pCVar16 = pCVar3;
      }
    }
    else {
      pCVar16 = pCVar18;
      if (lVar7 == 2) {
LAB_001f3220:
        if (((pCVar16->global_image != bVar22) || (pCVar16->global_sampler != bVar21)) ||
           (((pCVar16->image_id).id != image_id.id || ((pCVar16->sampler_id).id != samp_id.id)))) {
          pCVar18 = pCVar16 + 1;
          goto LAB_001f3241;
        }
      }
      else {
        pCVar16 = pCVar3;
        if ((lVar7 == 3) &&
           (((pCVar18->global_image != bVar22 || (pCVar18->global_sampler != bVar21)) ||
            (((pCVar18->image_id).id != image_id.id ||
             (pCVar16 = pCVar18, (pCVar18->sampler_id).id != samp_id.id)))))) {
          pCVar16 = pCVar18 + 1;
          goto LAB_001f3220;
        }
      }
    }
LAB_001f32dc:
    if (pCVar16 == pCVar3) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,
                 "Cannot find mapping for combined sampler parameter, was build_combined_image_samplers() used before compile() was called?"
                 ,"");
      ::std::runtime_error::runtime_error(prVar11,(string *)&local_90);
      *(undefined ***)prVar11 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    to_expression_abi_cxx11_(&local_90,this,(pCVar16->id).id,true);
    plVar10 = (long *)::std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
    goto LAB_001f330d;
  }
  pCVar12 = (this->super_Compiler).combined_image_samplers.
            super_VectorView<spirv_cross::CombinedImageSampler>.ptr;
  sVar6 = (this->super_Compiler).combined_image_samplers.
          super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size;
  pCVar2 = pCVar12 + sVar6;
  lVar7 = (long)sVar6 >> 2;
  pCVar15 = pCVar12;
  if (0 < lVar7) {
    pCVar15 = pCVar12 + lVar7 * 4;
    lVar7 = lVar7 + 1;
    pCVar12 = pCVar12 + 2;
    do {
      if ((pCVar12[-2].image_id.id == image_id.id) && (pCVar12[-2].sampler_id.id == samp_id.id)) {
        pCVar12 = pCVar12 + -2;
        goto LAB_001f3299;
      }
      if ((pCVar12[-1].image_id.id == image_id.id) && (pCVar12[-1].sampler_id.id == samp_id.id)) {
        pCVar12 = pCVar12 + -1;
        goto LAB_001f3299;
      }
      if (((pCVar12->image_id).id == image_id.id) && ((pCVar12->sampler_id).id == samp_id.id))
      goto LAB_001f3299;
      if ((pCVar12[1].image_id.id == image_id.id) && (pCVar12[1].sampler_id.id == samp_id.id)) {
        pCVar12 = pCVar12 + 1;
        goto LAB_001f3299;
      }
      lVar7 = lVar7 + -1;
      pCVar12 = pCVar12 + 4;
    } while (1 < lVar7);
  }
  lVar7 = ((long)pCVar2 - (long)pCVar15 >> 2) * -0x5555555555555555;
  if (lVar7 == 1) {
LAB_001f3285:
    pCVar12 = pCVar2;
    if (((pCVar15->image_id).id == image_id.id) &&
       (pCVar12 = pCVar15, (pCVar15->sampler_id).id != samp_id.id)) {
      pCVar12 = pCVar2;
    }
  }
  else {
    pCVar12 = pCVar15;
    if (lVar7 == 2) {
LAB_001f30e3:
      if (((pCVar12->image_id).id != image_id.id) || ((pCVar12->sampler_id).id != samp_id.id)) {
        pCVar15 = pCVar12 + 1;
        goto LAB_001f3285;
      }
    }
    else {
      pCVar12 = pCVar2;
      if ((lVar7 == 3) &&
         (((pCVar15->image_id).id != image_id.id ||
          (pCVar12 = pCVar15, (pCVar15->sampler_id).id != samp_id.id)))) {
        pCVar12 = pCVar15 + 1;
        goto LAB_001f30e3;
      }
    }
  }
LAB_001f3299:
  if (pCVar12 == pCVar2) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "Cannot find mapping for combined sampler, was build_combined_image_samplers() used before compile() was called?"
               ,"");
    ::std::runtime_error::runtime_error(prVar11,(string *)&local_90);
    *(undefined ***)prVar11 = &PTR__runtime_error_003d7e38;
    __cxa_throw(prVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  to_expression_abi_cxx11_(&local_90,this,(pCVar12->combined_id).id,true);
  plVar10 = (long *)::std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
LAB_001f330d:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar13 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar13) {
    lVar7 = plVar10[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar10;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
  }
  __return_storage_ptr__->_M_string_length = plVar10[1];
  *plVar10 = (long)psVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_combined_image_sampler(VariableID image_id, VariableID samp_id)
{
	// Keep track of the array indices we have used to load the image.
	// We'll need to use the same array index into the combined image sampler array.
	auto image_expr = to_non_uniform_aware_expression(image_id);
	string array_expr;
	auto array_index = image_expr.find_first_of('[');
	if (array_index != string::npos)
		array_expr = image_expr.substr(array_index, string::npos);

	auto &args = current_function->arguments;

	// For GLSL and ESSL targets, we must enumerate all possible combinations for sampler2D(texture2D, sampler) and redirect
	// all possible combinations into new sampler2D uniforms.
	auto *image = maybe_get_backing_variable(image_id);
	auto *samp = maybe_get_backing_variable(samp_id);
	if (image)
		image_id = image->self;
	if (samp)
		samp_id = samp->self;

	auto image_itr = find_if(begin(args), end(args),
	                         [image_id](const SPIRFunction::Parameter &param) { return image_id == param.id; });

	auto sampler_itr = find_if(begin(args), end(args),
	                           [samp_id](const SPIRFunction::Parameter &param) { return samp_id == param.id; });

	if (image_itr != end(args) || sampler_itr != end(args))
	{
		// If any parameter originates from a parameter, we will find it in our argument list.
		bool global_image = image_itr == end(args);
		bool global_sampler = sampler_itr == end(args);
		VariableID iid = global_image ? image_id : VariableID(uint32_t(image_itr - begin(args)));
		VariableID sid = global_sampler ? samp_id : VariableID(uint32_t(sampler_itr - begin(args)));

		auto &combined = current_function->combined_parameters;
		auto itr = find_if(begin(combined), end(combined), [=](const SPIRFunction::CombinedImageSamplerParameter &p) {
			return p.global_image == global_image && p.global_sampler == global_sampler && p.image_id == iid &&
			       p.sampler_id == sid;
		});

		if (itr != end(combined))
			return to_expression(itr->id) + array_expr;
		else
		{
			SPIRV_CROSS_THROW("Cannot find mapping for combined sampler parameter, was "
			                  "build_combined_image_samplers() used "
			                  "before compile() was called?");
		}
	}
	else
	{
		// For global sampler2D, look directly at the global remapping table.
		auto &mapping = combined_image_samplers;
		auto itr = find_if(begin(mapping), end(mapping), [image_id, samp_id](const CombinedImageSampler &combined) {
			return combined.image_id == image_id && combined.sampler_id == samp_id;
		});

		if (itr != end(combined_image_samplers))
			return to_expression(itr->combined_id) + array_expr;
		else
		{
			SPIRV_CROSS_THROW("Cannot find mapping for combined sampler, was build_combined_image_samplers() used "
			                  "before compile() was called?");
		}
	}
}